

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepVertex * __thiscall ON_BrepTrim::Vertex(ON_BrepTrim *this,int tvi)

{
  int iVar1;
  ON_Brep *pOVar2;
  
  pOVar2 = this->m_brep;
  if ((uint)tvi < 2 && pOVar2 != (ON_Brep *)0x0) {
    iVar1 = this->m_vi[(uint)tvi];
    if ((-1 < (long)iVar1) &&
       (iVar1 < (pOVar2->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                .m_count)) {
      return (pOVar2->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
             m_a + iVar1;
    }
  }
  return (ON_BrepVertex *)0x0;
}

Assistant:

ON_BrepVertex* ON_BrepTrim::Vertex(int tvi) const
{
  ON_BrepVertex* vertex = 0;
  if ( 0 != m_brep && 0 <= tvi && tvi <= 1 )
  {
    int vi = m_vi[tvi];
    if ( 0 <= vi && vi < m_brep->m_V.Count() )
    {
      vertex = &m_brep->m_V[vi];
    }
  }
  return vertex;  
}